

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void handle_fpfpcvt(DisasContext_conflict1 *s,int rd,int rn,int opcode,_Bool itof,int rmode,
                   int scale,int sf,int type)

{
  TCGContext_conflict1 *tcg_ctx;
  int iVar1;
  TCGv_ptr arg2;
  TCGv_i32 arg2_00;
  TCGv_i64 pTVar2;
  TCGv_i64 arg1;
  TCGv_i64 pTVar3;
  TCGv_i32 pTVar4;
  uintptr_t o_2;
  code *pcVar5;
  undefined7 in_register_00000081;
  uintptr_t o;
  TCGTemp *ret;
  uintptr_t o_3;
  uintptr_t o_4;
  uintptr_t o_1;
  TCGTemp *local_48;
  TCGv_i32 local_40;
  TCGv_ptr local_38;
  
  tcg_ctx = s->uc->tcg_ctx;
  arg2 = get_fpstatus_ptr_aarch64(tcg_ctx,type == 3);
  arg2_00 = tcg_const_i32_aarch64(tcg_ctx,0x40 - scale);
  if ((int)CONCAT71(in_register_00000081,itof) == 0) {
    pTVar2 = cpu_reg_aarch64(s,rd);
    iVar1 = 4;
    if ((opcode & 4U) == 0) {
      iVar1 = rmode;
    }
    iVar1 = arm_rmode_to_sf_aarch64(iVar1);
    pTVar3 = (TCGv_i64)tcg_const_i32_aarch64(tcg_ctx,iVar1);
    gen_helper_set_rmode(tcg_ctx,(TCGv_i32)pTVar3,(TCGv_i32)pTVar3,arg2);
    if (type == 0) {
      arg1 = (TCGv_i64)read_fp_sreg(s,rn);
      if (sf == 0) {
        pTVar4 = tcg_temp_new_i32(tcg_ctx);
        if ((opcode & 1U) == 0) {
          gen_helper_vfp_tosls(tcg_ctx,pTVar4,(TCGv_i32)arg1,arg2_00,arg2);
        }
        else {
          gen_helper_vfp_touls(tcg_ctx,pTVar4,(TCGv_i32)arg1,arg2_00,arg2);
        }
        tcg_gen_extu_i32_i64_aarch64(tcg_ctx,pTVar2,pTVar4);
        tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
      }
      else {
        local_48 = (TCGTemp *)((TCGv_i32)arg1 + (long)&tcg_ctx->pool_cur);
        local_40 = arg2_00 + (long)&tcg_ctx->pool_cur;
        local_38 = arg2 + (long)&tcg_ctx->pool_cur;
        if ((opcode & 1U) == 0) {
          pcVar5 = helper_vfp_tosqs_aarch64;
        }
        else {
          pcVar5 = helper_vfp_touqs_aarch64;
        }
        tcg_gen_callN_aarch64(tcg_ctx,pcVar5,(TCGTemp *)(pTVar2 + (long)tcg_ctx),3,&local_48);
      }
    }
    else if (type == 3) {
      arg1 = (TCGv_i64)read_fp_sreg(s,rn);
      if (sf == 0) {
        pTVar4 = tcg_temp_new_i32(tcg_ctx);
        local_48 = (TCGTemp *)((TCGv_i32)arg1 + (long)&tcg_ctx->pool_cur);
        local_40 = arg2_00 + (long)&tcg_ctx->pool_cur;
        local_38 = arg2 + (long)&tcg_ctx->pool_cur;
        if ((opcode & 1U) == 0) {
          pcVar5 = helper_vfp_toslh_aarch64;
        }
        else {
          pcVar5 = helper_vfp_toulh_aarch64;
        }
        tcg_gen_callN_aarch64(tcg_ctx,pcVar5,(TCGTemp *)(pTVar4 + (long)tcg_ctx),3,&local_48);
        tcg_gen_extu_i32_i64_aarch64(tcg_ctx,pTVar2,pTVar4);
        tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
      }
      else {
        local_48 = (TCGTemp *)((TCGv_i32)arg1 + (long)&tcg_ctx->pool_cur);
        local_40 = arg2_00 + (long)&tcg_ctx->pool_cur;
        local_38 = arg2 + (long)&tcg_ctx->pool_cur;
        if ((opcode & 1U) == 0) {
          pcVar5 = helper_vfp_tosqh_aarch64;
        }
        else {
          pcVar5 = helper_vfp_touqh_aarch64;
        }
        tcg_gen_callN_aarch64(tcg_ctx,pcVar5,(TCGTemp *)(pTVar2 + (long)tcg_ctx),3,&local_48);
      }
    }
    else {
      if (type != 1) {
        iVar1 = 0x1aba;
        goto LAB_0063277e;
      }
      arg1 = read_fp_dreg(s,rn);
      if ((opcode & 1U) == 0) {
        if (sf == 0) {
          pcVar5 = helper_vfp_tosld_aarch64;
LAB_006326f3:
          local_38 = arg2 + (long)&tcg_ctx->pool_cur;
          local_40 = arg2_00 + (long)&tcg_ctx->pool_cur;
          local_48 = (TCGTemp *)(arg1 + (long)&tcg_ctx->pool_cur);
          tcg_gen_callN_aarch64(tcg_ctx,pcVar5,(TCGTemp *)(pTVar2 + (long)tcg_ctx),3,&local_48);
          tcg_gen_ext32u_i64_aarch64(tcg_ctx,pTVar2,pTVar2);
        }
        else {
          gen_helper_vfp_tosqd(tcg_ctx,pTVar2,arg1,arg2_00,arg2);
        }
      }
      else {
        if (sf == 0) {
          pcVar5 = helper_vfp_tould_aarch64;
          goto LAB_006326f3;
        }
        gen_helper_vfp_touqd(tcg_ctx,pTVar2,arg1,arg2_00,arg2);
      }
    }
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(arg1 + (long)tcg_ctx));
    gen_helper_set_rmode(tcg_ctx,(TCGv_i32)pTVar3,(TCGv_i32)pTVar3,arg2);
LAB_0063272b:
    ret = (TCGTemp *)((TCGv_i32)pTVar3 + (long)tcg_ctx);
  }
  else {
    pTVar2 = cpu_reg_aarch64(s,rn);
    if (sf == 0) {
      pTVar3 = new_tmp_a64_aarch64(s);
      if ((opcode & 1U) == 0) {
        tcg_gen_ext32s_i64_aarch64(tcg_ctx,pTVar3,pTVar2);
        pTVar2 = pTVar3;
      }
      else {
        tcg_gen_ext32u_i64_aarch64(tcg_ctx,pTVar3,pTVar2);
        pTVar2 = pTVar3;
      }
    }
    if (type == 0) {
      pTVar4 = tcg_temp_new_i32(tcg_ctx);
      local_48 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
      local_40 = arg2_00 + (long)&tcg_ctx->pool_cur;
      local_38 = arg2 + (long)&tcg_ctx->pool_cur;
      ret = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
      if ((opcode & 1U) == 0) {
        pcVar5 = helper_vfp_sqtos_aarch64;
      }
      else {
        pcVar5 = helper_vfp_uqtos_aarch64;
      }
      tcg_gen_callN_aarch64(tcg_ctx,pcVar5,ret,3,&local_48);
    }
    else {
      if (type != 3) {
        if (type != 1) {
          iVar1 = 0x1a5c;
LAB_0063277e:
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                     ,iVar1,(char *)0x0);
        }
        pTVar3 = tcg_temp_new_i64(tcg_ctx);
        if ((opcode & 1U) == 0) {
          gen_helper_vfp_sqtod(tcg_ctx,pTVar3,pTVar2,arg2_00,arg2);
        }
        else {
          gen_helper_vfp_uqtod(tcg_ctx,pTVar3,pTVar2,arg2_00,arg2);
        }
        write_fp_dreg_aarch64(s,rd,pTVar3);
        goto LAB_0063272b;
      }
      pTVar4 = tcg_temp_new_i32(tcg_ctx);
      local_48 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
      local_40 = arg2_00 + (long)&tcg_ctx->pool_cur;
      local_38 = arg2 + (long)&tcg_ctx->pool_cur;
      ret = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
      if ((opcode & 1U) == 0) {
        pcVar5 = helper_vfp_sqtoh_aarch64;
      }
      else {
        pcVar5 = helper_vfp_uqtoh_aarch64;
      }
      tcg_gen_callN_aarch64(tcg_ctx,pcVar5,ret,3,&local_48);
    }
    write_fp_sreg(s,rd,pTVar4);
  }
  tcg_temp_free_internal_aarch64(tcg_ctx,ret);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(arg2 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(arg2_00 + (long)tcg_ctx));
  return;
}

Assistant:

static void handle_fpfpcvt(DisasContext *s, int rd, int rn, int opcode,
                           bool itof, int rmode, int scale, int sf, int type)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    bool is_signed = !(opcode & 1);
    TCGv_ptr tcg_fpstatus;
    TCGv_i32 tcg_shift, tcg_single;
    TCGv_i64 tcg_double;

    tcg_fpstatus = get_fpstatus_ptr(tcg_ctx, type == 3);

    tcg_shift = tcg_const_i32(tcg_ctx, 64 - scale);

    if (itof) {
        TCGv_i64 tcg_int = cpu_reg(s, rn);
        if (!sf) {
            TCGv_i64 tcg_extend = new_tmp_a64(s);

            if (is_signed) {
                tcg_gen_ext32s_i64(tcg_ctx, tcg_extend, tcg_int);
            } else {
                tcg_gen_ext32u_i64(tcg_ctx, tcg_extend, tcg_int);
            }

            tcg_int = tcg_extend;
        }

        switch (type) {
        case 1: /* float64 */
            tcg_double = tcg_temp_new_i64(tcg_ctx);
            if (is_signed) {
                gen_helper_vfp_sqtod(tcg_ctx, tcg_double, tcg_int,
                                     tcg_shift, tcg_fpstatus);
            } else {
                gen_helper_vfp_uqtod(tcg_ctx, tcg_double, tcg_int,
                                     tcg_shift, tcg_fpstatus);
            }
            write_fp_dreg(s, rd, tcg_double);
            tcg_temp_free_i64(tcg_ctx, tcg_double);
            break;

        case 0: /* float32 */
            tcg_single = tcg_temp_new_i32(tcg_ctx);
            if (is_signed) {
                gen_helper_vfp_sqtos(tcg_ctx, tcg_single, tcg_int,
                                     tcg_shift, tcg_fpstatus);
            } else {
                gen_helper_vfp_uqtos(tcg_ctx, tcg_single, tcg_int,
                                     tcg_shift, tcg_fpstatus);
            }
            write_fp_sreg(s, rd, tcg_single);
            tcg_temp_free_i32(tcg_ctx, tcg_single);
            break;

        case 3: /* float16 */
            tcg_single = tcg_temp_new_i32(tcg_ctx);
            if (is_signed) {
                gen_helper_vfp_sqtoh(tcg_ctx, tcg_single, tcg_int,
                                     tcg_shift, tcg_fpstatus);
            } else {
                gen_helper_vfp_uqtoh(tcg_ctx, tcg_single, tcg_int,
                                     tcg_shift, tcg_fpstatus);
            }
            write_fp_sreg(s, rd, tcg_single);
            tcg_temp_free_i32(tcg_ctx, tcg_single);
            break;

        default:
            g_assert_not_reached();
        }
    } else {
        TCGv_i64 tcg_int = cpu_reg(s, rd);
        TCGv_i32 tcg_rmode;

        if (extract32(opcode, 2, 1)) {
            /* There are too many rounding modes to all fit into rmode,
             * so FCVTA[US] is a special case.
             */
            rmode = FPROUNDING_TIEAWAY;
        }

        tcg_rmode = tcg_const_i32(tcg_ctx, arm_rmode_to_sf(rmode));

        gen_helper_set_rmode(tcg_ctx, tcg_rmode, tcg_rmode, tcg_fpstatus);

        switch (type) {
        case 1: /* float64 */
            tcg_double = read_fp_dreg(s, rn);
            if (is_signed) {
                if (!sf) {
                    gen_helper_vfp_tosld(tcg_ctx, tcg_int, tcg_double,
                                         tcg_shift, tcg_fpstatus);
                } else {
                    gen_helper_vfp_tosqd(tcg_ctx, tcg_int, tcg_double,
                                         tcg_shift, tcg_fpstatus);
                }
            } else {
                if (!sf) {
                    gen_helper_vfp_tould(tcg_ctx, tcg_int, tcg_double,
                                         tcg_shift, tcg_fpstatus);
                } else {
                    gen_helper_vfp_touqd(tcg_ctx, tcg_int, tcg_double,
                                         tcg_shift, tcg_fpstatus);
                }
            }
            if (!sf) {
                tcg_gen_ext32u_i64(tcg_ctx, tcg_int, tcg_int);
            }
            tcg_temp_free_i64(tcg_ctx, tcg_double);
            break;

        case 0: /* float32 */
            tcg_single = read_fp_sreg(s, rn);
            if (sf) {
                if (is_signed) {
                    gen_helper_vfp_tosqs(tcg_ctx, tcg_int, tcg_single,
                                         tcg_shift, tcg_fpstatus);
                } else {
                    gen_helper_vfp_touqs(tcg_ctx, tcg_int, tcg_single,
                                         tcg_shift, tcg_fpstatus);
                }
            } else {
                TCGv_i32 tcg_dest = tcg_temp_new_i32(tcg_ctx);
                if (is_signed) {
                    gen_helper_vfp_tosls(tcg_ctx, tcg_dest, tcg_single,
                                         tcg_shift, tcg_fpstatus);
                } else {
                    gen_helper_vfp_touls(tcg_ctx, tcg_dest, tcg_single,
                                         tcg_shift, tcg_fpstatus);
                }
                tcg_gen_extu_i32_i64(tcg_ctx, tcg_int, tcg_dest);
                tcg_temp_free_i32(tcg_ctx, tcg_dest);
            }
            tcg_temp_free_i32(tcg_ctx, tcg_single);
            break;

        case 3: /* float16 */
            tcg_single = read_fp_sreg(s, rn);
            if (sf) {
                if (is_signed) {
                    gen_helper_vfp_tosqh(tcg_ctx, tcg_int, tcg_single,
                                         tcg_shift, tcg_fpstatus);
                } else {
                    gen_helper_vfp_touqh(tcg_ctx, tcg_int, tcg_single,
                                         tcg_shift, tcg_fpstatus);
                }
            } else {
                TCGv_i32 tcg_dest = tcg_temp_new_i32(tcg_ctx);
                if (is_signed) {
                    gen_helper_vfp_toslh(tcg_ctx, tcg_dest, tcg_single,
                                         tcg_shift, tcg_fpstatus);
                } else {
                    gen_helper_vfp_toulh(tcg_ctx, tcg_dest, tcg_single,
                                         tcg_shift, tcg_fpstatus);
                }
                tcg_gen_extu_i32_i64(tcg_ctx, tcg_int, tcg_dest);
                tcg_temp_free_i32(tcg_ctx, tcg_dest);
            }
            tcg_temp_free_i32(tcg_ctx, tcg_single);
            break;

        default:
            g_assert_not_reached();
        }

        gen_helper_set_rmode(tcg_ctx, tcg_rmode, tcg_rmode, tcg_fpstatus);
        tcg_temp_free_i32(tcg_ctx, tcg_rmode);
    }

    tcg_temp_free_ptr(tcg_ctx, tcg_fpstatus);
    tcg_temp_free_i32(tcg_ctx, tcg_shift);
}